

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

void pybind11::detail::clear_patients(PyObject *self)

{
  pointer pp_Var1;
  PyObject *op;
  internals *piVar2;
  iterator __it;
  long in_RDI;
  iterator __end2;
  iterator __begin2;
  pointer pp_Var3;
  type patients;
  _Vector_base<_object_*,_std::allocator<_object_*>_> local_40;
  key_type local_28;
  
  piVar2 = get_internals();
  __it = std::
         _Hashtable<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(piVar2->patients)._M_h,&local_28);
  if (__it.
      super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pp_Var3 = *(pointer *)
               ((long)__it.
                      super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                      ._M_cur + 0x10);
    pp_Var1 = *(pointer *)
               ((long)__it.
                      super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                      ._M_cur + 0x18);
    local_40._M_impl.super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          ((long)__it.
                 super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                 ._M_cur + 0x20);
    *(undefined8 *)
     ((long)__it.
            super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
            ._M_cur + 0x10) = 0;
    *(undefined8 *)
     ((long)__it.
            super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
            ._M_cur + 0x18) = 0;
    *(undefined8 *)
     ((long)__it.
            super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
            ._M_cur + 0x20) = 0;
    local_40._M_impl.super__Vector_impl_data._M_start = pp_Var3;
    local_40._M_impl.super__Vector_impl_data._M_finish = pp_Var1;
    std::
    _Hashtable<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(piVar2->patients)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
            ._M_cur);
    *(byte *)(in_RDI + 0x30) = *(byte *)(in_RDI + 0x30) & 0xef;
    for (; pp_Var3 != pp_Var1; pp_Var3 = pp_Var3 + 1) {
      op = *pp_Var3;
      if (op != (PyObject *)0x0) {
        *pp_Var3 = (_object *)0x0;
        _Py_DECREF(op);
      }
    }
    std::_Vector_base<_object_*,_std::allocator<_object_*>_>::~_Vector_base(&local_40);
    return;
  }
  __assert_fail("pos != internals.patients.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/jtgrassie[P]pyrx/external/pybind11/include/pybind11/detail/class.h"
                ,0x12e,"void pybind11::detail::clear_patients(PyObject *)");
}

Assistant:

inline void clear_patients(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);
    auto &internals = get_internals();
    auto pos = internals.patients.find(self);
    assert(pos != internals.patients.end());
    // Clearing the patients can cause more Python code to run, which
    // can invalidate the iterator. Extract the vector of patients
    // from the unordered_map first.
    auto patients = std::move(pos->second);
    internals.patients.erase(pos);
    instance->has_patients = false;
    for (PyObject *&patient : patients)
        Py_CLEAR(patient);
}